

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

int Abc_NtkCrossCut(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  Abc_Obj_t *pObj;
  int i;
  int nCutSize;
  int nCutSizeMax;
  int local_28;
  uint local_24;
  
  local_28 = 0;
  local_24 = 0;
  Abc_NtkCleanCopy(pNtk);
  Abc_NtkIncrementTravId(pNtk);
  iVar2 = 0;
  for (i = 0; uVar1 = local_24, i < pNtk->vCos->nSize; i = i + 1) {
    pObj = Abc_NtkCo(pNtk,i);
    Abc_NtkCrossCut_rec(pObj,&local_28,(int *)&local_24);
    iVar2 = local_28 + -1;
    local_28 = iVar2;
  }
  if (iVar2 == 0) {
    printf("Max cross cut size = %6d.  Ratio = %6.2f %%\n",
           ((double)(int)local_24 * 100.0) / (double)pNtk->nObjs,(ulong)local_24);
    return uVar1;
  }
  __assert_fail("nCutSize == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                ,0x80c,"int Abc_NtkCrossCut(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkCrossCut( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int nCutSize = 0, nCutSizeMax = 0;
    int i;
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Abc_NtkCrossCut_rec( pObj, &nCutSize, &nCutSizeMax );
        nCutSize--;
    }
    assert( nCutSize == 0 );
    printf( "Max cross cut size = %6d.  Ratio = %6.2f %%\n", nCutSizeMax, 100.0 * nCutSizeMax/Abc_NtkObjNum(pNtk) );
    return nCutSizeMax;
}